

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O2

sexp_sint_t sexp_object_compare(sexp_conflict ctx,sexp_conflict a,sexp_conflict b,int depth)

{
  sexp_tag_t sVar1;
  sexp psVar2;
  sbyte sVar3;
  int iVar4;
  long lVar5;
  sexp_sint_t sVar6;
  long lVar7;
  sbyte sVar8;
  sbyte sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  sexp psVar14;
  ulong uVar15;
  char *__s2;
  char cVar16;
  ulong uVar17;
  sexp_conflict psVar18;
  ulong uVar19;
  char cVar20;
  long local_38;
  
  local_38 = 0;
  while( true ) {
    lVar5 = (long)a - (long)b;
    if (lVar5 == 0) {
      return 0;
    }
    if (((ulong)a & 3) != 0) break;
    if (((ulong)b & 3) != 0) {
      if ((((ulong)b & 1) == 0) || (2 < a->tag - 0xb)) {
        if (((uint)b & 0xf) != 6) {
          return 1;
        }
        if (a->tag != 7) {
          return 1;
        }
        pcVar13 = (a->value).flonum_bits + 8;
        lVar5 = sexp_write_to_string(ctx,b);
        lVar5 = *(long *)(lVar5 + 8);
        lVar7 = sexp_write_to_string(ctx,b);
        __s2 = (char *)(lVar5 + *(long *)(lVar7 + 0x10) + 0x10);
        goto LAB_00101914;
      }
      goto LAB_001018a2;
    }
    sVar1 = a->tag;
    uVar10 = sVar1 - b->tag;
    if (uVar10 != 0) {
      if (2 < sVar1 - 0xb) {
        return (ulong)uVar10;
      }
      if (2 < b->tag - 0xb) {
        return (ulong)uVar10;
      }
      goto LAB_001018a2;
    }
    if (depth < 1) {
      return 0;
    }
    switch(sVar1) {
    case 6:
      depth = depth + -1;
      lVar5 = 0;
      psVar18 = (a->value).type.cpl;
      for (; ((((lVar5 == 0 && (a != psVar18)) && (((ulong)a & 3) == 0)) &&
              ((a->tag == 6 && (((ulong)b & 3) == 0)))) && (b->tag == 6)); b = (b->value).type.cpl)
      {
        lVar5 = sexp_object_compare(ctx,(a->value).type.name,(b->value).type.name,depth);
        psVar14 = (sexp)&DAT_0000023e;
        if (((((ulong)psVar18 & 3) == 0) && (psVar18->tag == 6)) &&
           ((psVar2 = (psVar18->value).type.cpl, ((ulong)psVar2 & 3) == 0 &&
            (psVar14 = psVar2, psVar2->tag != 6)))) {
          psVar14 = (sexp)&DAT_0000023e;
        }
        a = (a->value).type.cpl;
        psVar18 = psVar14;
      }
      if ((((ulong)psVar18 & 3) == 0) && (psVar18->tag == 6)) {
        if (((ulong)b & 3) != 0) {
          return 1;
        }
        if (b->tag != 6) {
          return 1;
        }
      }
      if ((((ulong)b & 3) == 0) && (b->tag == 6)) {
        if (((ulong)psVar18 & 3) != 0) {
          return -1;
        }
        if (psVar18->tag != 6) {
          return -1;
        }
      }
      if ((b == (sexp_conflict)&DAT_0000023e && a == (sexp_conflict)&DAT_0000023e) || (lVar5 != 0))
      {
        if (b == (sexp_conflict)&DAT_0000023e && a == (sexp_conflict)&DAT_0000023e) {
          return 0;
        }
        return lVar5;
      }
      break;
    case 7:
      goto LAB_00101911;
    default:
      goto switchD_00101265_caseD_8;
    case 9:
      pcVar13 = (((a->value).type.cpl)->value).flonum_bits +
                (long)(((a->value).type.name)->value).flonum_bits;
      __s2 = (((b->value).type.cpl)->value).flonum_bits +
             (long)(((b->value).type.name)->value).flonum_bits;
      goto LAB_00101914;
    case 10:
      psVar14 = (a->value).type.name;
      lVar5 = (long)psVar14 - (b->value).stack.length;
      lVar7 = 0;
      while( true ) {
        if (lVar5 != 0) {
          return lVar5;
        }
        if ((long)psVar14 <= lVar7) break;
        lVar5 = sexp_object_compare(ctx,*(sexp_conflict *)((long)&a->value + lVar7 * 8 + 8),
                                    *(sexp_conflict *)((long)&b->value + lVar7 * 8 + 8),depth + -1);
        lVar7 = lVar7 + 1;
      }
      return 0;
    case 0xb:
      if ((a->value).flonum <= (b->value).flonum) {
        return -(ulong)((a->value).flonum < (b->value).flonum);
      }
      return 1;
    case 0xc:
      sVar6 = sexp_bignum_compare(a,b);
      return sVar6;
    case 0xd:
      lVar5 = sexp_ratio_compare(ctx,a,b);
      goto LAB_0010192e;
    case 0xe:
      depth = depth + -1;
      sVar6 = sexp_object_compare(ctx,(a->value).type.name,(b->value).type.name,depth);
      if (sVar6 != 0) {
        return sVar6;
      }
      a = (a->value).type.cpl;
      b = (b->value).type.cpl;
    }
  }
  if (((ulong)b & 3) == 0) {
    if ((((ulong)a & 1) == 0) || (2 < b->tag - 0xb)) {
      if (((uint)a & 0xf) != 6) {
        return -1;
      }
      if (b->tag != 7) {
        return -1;
      }
      lVar5 = sexp_write_to_string(ctx,a);
      lVar5 = *(long *)(lVar5 + 8);
      lVar7 = sexp_write_to_string(ctx,a);
      a = (sexp_conflict)(lVar5 + *(long *)(lVar7 + 0x10));
LAB_00101911:
      pcVar13 = (a->value).flonum_bits + 8;
      __s2 = (b->value).flonum_bits + 8;
LAB_00101914:
      iVar4 = strcmp(pcVar13,__s2);
      return (long)iVar4;
    }
LAB_001018a2:
    lVar5 = sexp_compare(ctx,a,b);
LAB_0010192e:
    return lVar5 >> 1;
  }
  if (((uint)a & 0xf) != 6) {
    return lVar5;
  }
  if (((uint)b & 0xf) != 6) {
    return lVar5;
  }
  sVar3 = 4;
  uVar15 = (ulong)a >> 4;
  uVar19 = (ulong)b >> 4;
  do {
    if ((uVar15 == 0) || (uVar19 == 0)) {
      iVar4 = 1;
      if (uVar15 == 0) {
        iVar4 = -(uint)(uVar19 != 0);
      }
      break;
    }
    uVar17 = uVar15 >> 3;
    uVar10 = (uint)uVar17;
    sVar9 = 7;
    sVar8 = sVar3;
    switch((uint)uVar15 & 7) {
    case 0:
      uVar17 = uVar15 >> 5;
      uVar11 = (uint)uVar17;
      if ((uVar15 & 0x18) != 0) {
        cVar20 = _huff_tab9[uVar10 & 3];
        if (cVar20 == '\0') {
          pcVar13 = _huff_tab10 + (uVar11 & 3);
          sVar8 = sVar9;
          break;
        }
        goto LAB_001014af;
      }
      uVar17 = uVar15 >> 7;
      uVar10 = (uint)uVar17;
      if ((uVar15 & 0x60) != 0) {
        cVar20 = _huff_tab11[uVar11 & 3];
        if (cVar20 == '\0') {
          pcVar13 = _huff_tab12 + (uVar10 & 1);
          sVar8 = 8;
          break;
        }
        goto LAB_001014af;
      }
      uVar17 = uVar15 >> 10;
      uVar11 = (uint)uVar17;
      switch(uVar10 & 7) {
      case 0:
        uVar17 = uVar15 >> 0xc;
        if ((uVar15 & 0xc00) == 0) {
          pcVar13 = _huff_tab21 + ((uint)uVar17 & 7);
        }
        else {
          cVar20 = _huff_tab19[uVar11 & 3];
          if (cVar20 != '\x01') goto LAB_001014af;
          pcVar13 = _huff_tab20 + ((uint)uVar17 & 7);
        }
        goto LAB_001017ed;
      case 1:
        pcVar13 = _huff_tab18 + (uVar11 & 0xf);
        break;
      case 2:
        pcVar13 = _huff_tab17 + (uVar11 & 0x1f);
LAB_001017ed:
        sVar8 = 0xf;
        goto LAB_001014a8;
      default:
        cVar20 = _huff_tab13[uVar10 & 7];
        if (cVar20 == '\0') {
          pcVar13 = _huff_tab14 + (uVar11 & 1);
          sVar8 = 0xb;
          goto LAB_001014a8;
        }
        goto LAB_001014af;
      case 4:
        pcVar13 = _huff_tab16 + (uVar11 & 0xf);
        break;
      case 5:
        pcVar13 = _huff_tab15 + (uVar11 & 0xf);
      }
      sVar8 = 0xe;
      break;
    case 1:
      pcVar13 = _huff_tab8 + (uVar10 & 3);
      sVar8 = 5;
      break;
    case 2:
      uVar17 = uVar15 >> 5;
      if ((uVar15 & 0x18) == 0) {
        pcVar13 = _huff_tab7 + ((uint)uVar17 & 3);
        sVar8 = sVar9;
      }
      else {
        cVar20 = _huff_tab5[uVar10 & 3];
        if (cVar20 != '\0') goto LAB_001014af;
        pcVar13 = _huff_tab6 + ((uint)uVar17 & 1);
        sVar8 = 6;
      }
      break;
    default:
      cVar20 = _huff_tab1[(uint)uVar15 & 7];
      if (cVar20 != '\0') goto LAB_001014af;
      pcVar13 = _huff_tab2 + (uVar10 & 1);
      break;
    case 4:
      pcVar13 = _huff_tab4 + (uVar10 & 1);
      break;
    case 5:
      pcVar13 = _huff_tab3 + (uVar10 & 1);
    }
LAB_001014a8:
    cVar20 = *pcVar13;
    uVar17 = uVar15 >> sVar8;
LAB_001014af:
    uVar12 = uVar19 >> 3;
    uVar10 = (uint)uVar12;
    switch((uint)uVar19 & 7) {
    case 0:
      uVar12 = uVar19 >> 5;
      uVar11 = (uint)uVar12;
      if ((uVar19 & 0x18) != 0) {
        cVar16 = _huff_tab9[uVar10 & 3];
        if (cVar16 == '\0') {
          pcVar13 = _huff_tab10 + (uVar11 & 3);
          break;
        }
        goto LAB_0010181c;
      }
      uVar12 = uVar19 >> 7;
      uVar10 = (uint)uVar12;
      if ((uVar19 & 0x60) != 0) {
        cVar16 = _huff_tab11[uVar11 & 3];
        if (cVar16 == '\0') {
          pcVar13 = _huff_tab12 + (uVar10 & 1);
          sVar9 = 8;
          break;
        }
        goto LAB_0010181c;
      }
      uVar12 = uVar19 >> 10;
      uVar11 = (uint)uVar12;
      switch(uVar10 & 7) {
      case 0:
        uVar12 = uVar19 >> 0xc;
        if ((uVar19 & 0xc00) == 0) {
          pcVar13 = _huff_tab21 + ((uint)uVar12 & 7);
          goto LAB_001017ff;
        }
        cVar16 = _huff_tab19[uVar11 & 3];
        if (cVar16 == '\x01') {
          pcVar13 = _huff_tab20 + ((uint)uVar12 & 7);
          sVar9 = 0xf;
          goto LAB_00101812;
        }
        goto LAB_0010181c;
      case 1:
        pcVar13 = _huff_tab18 + (uVar11 & 0xf);
        break;
      case 2:
        pcVar13 = _huff_tab17 + (uVar11 & 0x1f);
LAB_001017ff:
        sVar9 = 0xf;
        goto LAB_00101812;
      default:
        cVar16 = _huff_tab13[uVar10 & 7];
        if (cVar16 == '\0') {
          pcVar13 = _huff_tab14 + (uVar11 & 1);
          sVar9 = 0xb;
          goto LAB_00101812;
        }
        goto LAB_0010181c;
      case 4:
        pcVar13 = _huff_tab16 + (uVar11 & 0xf);
        break;
      case 5:
        pcVar13 = _huff_tab15 + (uVar11 & 0xf);
      }
      sVar9 = 0xe;
      break;
    case 1:
      pcVar13 = _huff_tab8 + (uVar10 & 3);
      sVar9 = 5;
      break;
    case 2:
      uVar12 = uVar19 >> 5;
      if ((uVar19 & 0x18) == 0) {
        pcVar13 = _huff_tab7 + ((uint)uVar12 & 3);
      }
      else {
        cVar16 = _huff_tab5[uVar10 & 3];
        if (cVar16 != '\0') goto LAB_0010181c;
        pcVar13 = _huff_tab6 + ((uint)uVar12 & 1);
        sVar9 = 6;
      }
      break;
    default:
      cVar16 = _huff_tab1[(uint)uVar19 & 7];
      if (cVar16 != '\0') goto LAB_0010181c;
      pcVar13 = _huff_tab2 + (uVar10 & 1);
      sVar9 = sVar3;
      break;
    case 4:
      pcVar13 = _huff_tab4 + (uVar10 & 1);
      sVar9 = sVar3;
      break;
    case 5:
      pcVar13 = _huff_tab3 + (uVar10 & 1);
      sVar9 = sVar3;
    }
LAB_00101812:
    cVar16 = *pcVar13;
    uVar12 = uVar19 >> sVar9;
LAB_0010181c:
    iVar4 = (int)cVar20 - (int)cVar16;
    uVar15 = uVar17;
    uVar19 = uVar12;
  } while (iVar4 == 0);
  local_38 = (long)iVar4;
switchD_00101265_caseD_8:
  return local_38;
}

Assistant:

static sexp_sint_t sexp_object_compare (sexp ctx, sexp a, sexp b, int depth) {
  sexp ls1, ls2;
  sexp_sint_t i, res, len;
  if (a == b)
    return 0;
  if (sexp_pointerp(a)) {
    if (sexp_pointerp(b)) {
      if (sexp_pointer_tag(a) == sexp_pointer_tag(b)) {
        if (depth <= 0)
          return 0;
        switch (sexp_pointer_tag(a)) {
#if SEXP_USE_FLONUMS
        case SEXP_FLONUM:
          res = sexp_flonum_value(a) > sexp_flonum_value(b) ? 1 :
                sexp_flonum_value(a) < sexp_flonum_value(b) ? -1 : 0;
          break;
#endif
#if SEXP_USE_BIGNUMS
        case SEXP_BIGNUM:
          res = sexp_bignum_compare(a, b);
          break;
#endif
#if SEXP_USE_RATIOS
        case SEXP_RATIO:
          res = sexp_unbox_fixnum(sexp_ratio_compare(ctx, a, b));
          break;
#endif
#if SEXP_USE_COMPLEX
        case SEXP_COMPLEX:
          res = sexp_object_compare(ctx, sexp_complex_real(a), sexp_complex_real(b), depth-1);
          if (res==0) res = sexp_object_compare(ctx, sexp_complex_imag(a), sexp_complex_imag(b), depth-1);
          break;
#endif
        case SEXP_STRING:
          res = strcmp(sexp_string_data(a), sexp_string_data(b));
          break;
        case SEXP_SYMBOL:
          res = strcmp(sexp_lsymbol_data(a), sexp_lsymbol_data(b));
          break;
        case SEXP_PAIR:
          for (res=0, ls1=a, ls2=sexp_cdr(a); res == 0 && ls1 != ls2 && sexp_pairp(ls1) && sexp_pairp(b) && sexp_pairp(b); ls1=sexp_cdr(ls1), ls2=((sexp_pairp(ls2)&&sexp_pairp(sexp_cdr(ls2)))?sexp_cdr(ls2):SEXP_NULL), b=sexp_cdr(b))
            res = sexp_object_compare(ctx, sexp_car(ls1), sexp_car(b), depth-1);
          if (sexp_pairp(ls2) && !sexp_pairp(b))
            res = 1;
          else if (sexp_pairp(b) && !sexp_pairp(ls2))
            res = -1;
          else if (ls1==SEXP_NULL && b==SEXP_NULL)
            res = 0;
          else if (res == 0)
            res = sexp_object_compare(ctx, ls1, b, depth-1);
          break;
        case SEXP_VECTOR:
          len = sexp_vector_length(a);
          res = len - sexp_vector_length(b);
          for (i=0; res == 0 && i < len; ++i)
            res = sexp_object_compare(ctx, sexp_vector_ref(a, sexp_make_fixnum(i)), sexp_vector_ref(b, sexp_make_fixnum(i)), depth-1);
          break;
        default:
          res = 0;
          break;
        }
      } else if (sexp_non_immediate_ordered_numberp(a) &&
                 sexp_non_immediate_ordered_numberp(b)) {
        res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
      } else {
        res = sexp_pointer_tag(a) - sexp_pointer_tag(b);
      }
#if SEXP_USE_BIGNUMS || SEXP_USE_FLONUMS
    } else if (sexp_fixnump(b) && sexp_non_immediate_ordered_numberp(a)) {
      res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
#endif
#if SEXP_USE_HUFF_SYMS
    } else if (sexp_isymbolp(b) && sexp_lsymbolp(a)) {
      res = strcmp(sexp_lsymbol_data(a),
                   sexp_string_data(sexp_write_to_string(ctx, b)));
#endif
    } else {
      res = 1;
    }
  } else if (sexp_pointerp(b)) {
#if SEXP_USE_BIGNUMS || SEXP_USE_FLONUMS
    if (sexp_fixnump(a) && sexp_non_immediate_ordered_numberp(b))
      res = sexp_unbox_fixnum(sexp_compare(ctx, a, b));
    else
#endif
#if SEXP_USE_HUFF_SYMS
    if (sexp_isymbolp(a) && sexp_lsymbolp(b))
      res = strcmp(sexp_string_data(sexp_write_to_string(ctx, a)),
                   sexp_lsymbol_data(b));
    else
#endif
      res = -1;
  } else {
#if SEXP_USE_HUFF_SYMS
    if (sexp_isymbolp(a) && sexp_isymbolp(b))
      return sexp_isymbol_compare(ctx, a, b);
    else
#endif
      res = (sexp_sint_t)a - (sexp_sint_t)b;
  }
  return res;
}